

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextProcessDock(ImGuiContext *ctx,ImGuiDockRequest *req)

{
  byte *pbVar1;
  ImVector<ImGuiWindow_*> *this;
  float fVar2;
  ImGuiID IVar3;
  ImGuiWindow *window;
  ImVec2 IVar4;
  ImGuiTabBar *tab_bar;
  ImGuiContext *pIVar5;
  ImGuiID *pIVar6;
  ImGuiDockNode *node;
  ImGuiTabItem *pIVar7;
  ImGuiDockNode *pIVar8;
  float *pfVar9;
  ImGuiDockNode *node_00;
  ImGuiDockNode *node_01;
  ImGuiWindow **ppIVar10;
  ImGuiDockNode *pIVar11;
  ImGuiDockNode *pIVar12;
  uint uVar13;
  ImGuiDockNode *src_node;
  int n;
  ImGuiID IVar14;
  int i;
  ImGuiWindow *window_00;
  ulong idx;
  bool bVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  bool local_89;
  
  if (req->Type == ImGuiDockRequestType_Split) {
    if (req->DockPayload != (ImGuiWindow *)0x0) goto LAB_0013da72;
    window_00 = (ImGuiWindow *)0x0;
  }
  else if ((req->Type != ImGuiDockRequestType_Dock) ||
          (window_00 = req->DockPayload, window_00 == (ImGuiWindow *)0x0)) {
LAB_0013da72:
    __assert_fail("(req->Type == ImGuiDockRequestType_Dock && req->DockPayload != __null) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == __null)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3391,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  window = req->DockTargetWindow;
  node = req->DockTargetNode;
  if (window == (ImGuiWindow *)0x0 && node == (ImGuiDockNode *)0x0) {
    __assert_fail("req->DockTargetWindow != __null || req->DockTargetNode != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3392,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
  }
  IVar14 = 0;
  if (window_00 == (ImGuiWindow *)0x0) {
    src_node = (ImGuiDockNode *)0x0;
  }
  else {
    src_node = window_00->DockNodeAsHost;
    window_00->DockNodeAsHost = (ImGuiDockNode *)0x0;
    if (src_node == (ImGuiDockNode *)0x0) {
      pIVar6 = &window_00->ID;
      src_node = (ImGuiDockNode *)0x0;
LAB_0013d4b5:
      IVar14 = *pIVar6;
    }
    else {
      IVar14 = 0;
      if (src_node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
        IVar14 = src_node->TabBar->NextSelectedTabId;
        if (IVar14 == 0) {
          pIVar6 = &src_node->TabBar->SelectedTabId;
          goto LAB_0013d4b5;
        }
      }
    }
  }
  if (node == (ImGuiDockNode *)0x0) {
    node = DockContextAddNode(ctx,0);
    node->Pos = window->Pos;
    node->Size = window->Size;
    if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      DockNodeAddWindow(node,window,true);
      pIVar7 = ImVector<ImGuiTabItem>::operator[](&node->TabBar->Tabs,0);
      pbVar1 = (byte *)((long)&pIVar7->Flags + 2);
      *pbVar1 = *pbVar1 & 0xbf;
      window->field_0x3e1 = window->field_0x3e1 | 1;
    }
  }
  else {
    if (ctx->FrameCount < node->LastFrameAlive) {
      __assert_fail("node->LastFrameAlive <= g.FrameCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x33af,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                   );
    }
    if ((((window != (ImGuiWindow *)0x0) && (node == window->DockNodeAsHost)) &&
        ((node->Windows).Size < 1)) &&
       ((node->ChildNodes[0] == (ImGuiDockNode *)0x0 && ((node->MergedFlags & 0x800) == 0)))) {
      __assert_fail("node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode()",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x33b1,"void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)"
                   );
    }
  }
  pIVar5 = GImGui;
  uVar16 = req->DockSplitDir;
  if (uVar16 == 0xffffffff) goto LAB_0013d845;
  fVar2 = req->DockSplitRatio;
  if (src_node == (ImGuiDockNode *)0x0 || (uVar16 & 0xfffffffd) != 0) {
    local_89 = (uVar16 & 0xfffffffd) != 0;
    pIVar11 = DockContextAddNode(ctx,0);
    pIVar11->ParentNode = node;
    pIVar8 = src_node;
    if (src_node == (ImGuiDockNode *)0x0 || !local_89) goto LAB_0013d613;
  }
  else {
    local_89 = (uVar16 & 0xfffffffd) != 0;
    src_node->ParentNode = node;
    pIVar11 = src_node;
LAB_0013d613:
    pIVar8 = DockContextAddNode(ctx,0);
  }
  idx = (ulong)(1 < uVar16);
  bVar15 = (uVar16 & 0xfffffffd) == 0;
  pIVar8->ParentNode = node;
  pIVar12 = pIVar11;
  if (bVar15) {
    pIVar12 = pIVar8;
  }
  DockNodeMoveChildNodes(pIVar12,node);
  node->ChildNodes[0] = pIVar11;
  node->ChildNodes[1] = pIVar8;
  node->ChildNodes[bVar15]->VisibleWindow = node->VisibleWindow;
  node->SplitAxis = (uint)(1 < uVar16);
  node->VisibleWindow = (ImGuiWindow *)0x0;
  *(ushort *)&node->field_0xbc = (ushort)*(undefined4 *)&node->field_0xbc & 0xffc0 | 9;
  pfVar9 = ImVec2::operator[](&node->Size,idx);
  fVar18 = *pfVar9;
  pfVar9 = ImVec2::operator[](&(pIVar5->Style).WindowMinSize,idx);
  fVar17 = *pfVar9 + *pfVar9;
  uVar16 = -(uint)(fVar17 <= fVar18 + -2.0);
  fVar18 = (float)(~uVar16 & (uint)fVar17 | (uint)(fVar18 + -2.0) & uVar16);
  if (fVar18 <= 0.0) {
    __assert_fail("size_avail > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3a6d,
                  "void ImGui::DockNodeTreeSplit(ImGuiContext *, ImGuiDockNode *, ImGuiAxis, int, float, ImGuiDockNode *)"
                 );
  }
  IVar4 = node->Size;
  pIVar8->SizeRef = IVar4;
  pIVar11->SizeRef = IVar4;
  pfVar9 = ImVec2::operator[](&pIVar11->SizeRef,idx);
  *pfVar9 = (float)(int)(fVar2 * fVar18);
  pfVar9 = ImVec2::operator[](&pIVar11->SizeRef,idx);
  fVar2 = *pfVar9;
  pfVar9 = ImVec2::operator[](&pIVar8->SizeRef,idx);
  *pfVar9 = (float)(int)(fVar18 - fVar2);
  DockNodeMoveWindows(node->ChildNodes[bVar15],node);
  DockSettingsRenameNodeReferences(node->ID,node->ChildNodes[bVar15]->ID);
  node_01 = DockNodeGetRootNode(node_00);
  DockNodeUpdateHasCentralNodeChild(node_01);
  DockNodeTreeUpdatePosSize(node,node->Pos,node->Size,false);
  uVar16 = node->SharedFlags;
  pIVar11->SharedFlags = uVar16;
  pIVar8->SharedFlags = uVar16;
  pIVar12->LocalFlags = node->LocalFlags & 0xc1f870;
  uVar13 = node->LocalFlags & 0xff3e078f;
  node->LocalFlags = uVar13;
  pIVar11->MergedFlags = pIVar11->LocalFlags | pIVar11->SharedFlags | pIVar11->LocalFlagsInWindows;
  pIVar8->MergedFlags = pIVar8->LocalFlags | pIVar8->LocalFlagsInWindows | uVar16;
  uVar13 = node->SharedFlags | node->LocalFlagsInWindows | uVar13;
  node->MergedFlags = uVar13;
  if ((pIVar12->MergedFlags & 0x800) != 0) {
    pIVar8 = DockNodeGetRootNode((ImGuiDockNode *)(ulong)uVar13);
    pIVar8->CentralNode = pIVar12;
  }
  ppIVar10 = &node->HostWindow;
  node = node->ChildNodes[local_89];
  node->HostWindow = *ppIVar10;
LAB_0013d845:
  uVar16 = node->LocalFlags & 0xffffdfff;
  node->LocalFlags = uVar16;
  node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar16;
  if (node == src_node) {
    node->field_0xbe = node->field_0xbe | 2;
  }
  else {
    this = &node->Windows;
    if ((node->Windows).Size < 1) {
      bVar15 = false;
    }
    else {
      bVar15 = true;
      if (node->TabBar == (ImGuiTabBar *)0x0) {
        DockNodeAddTabBar(node);
        for (i = 0; i < this->Size; i = i + 1) {
          tab_bar = node->TabBar;
          ppIVar10 = ImVector<ImGuiWindow_*>::operator[](this,i);
          TabBarAddTab(tab_bar,0,*ppIVar10);
        }
        bVar15 = 0 < this->Size;
      }
    }
    if (src_node == (ImGuiDockNode *)0x0) {
      if (window_00 != (ImGuiWindow *)0x0) {
        IVar3 = window_00->DockId;
        node->VisibleWindow = window_00;
        DockNodeAddWindow(node,window_00,true);
        if (IVar3 != 0) {
          DockSettingsRenameNodeReferences(IVar3,node->ID);
        }
      }
    }
    else {
      if (src_node->ChildNodes[0] == (ImGuiDockNode *)0x0) {
        IVar3 = src_node->ID;
        DockNodeMoveWindows(node,src_node);
        DockSettingsRenameNodeReferences(IVar3,node->ID);
      }
      else {
        if (bVar15) {
          pIVar8 = src_node->OnlyNodeWithWindows;
          if (pIVar8 == (ImGuiDockNode *)0x0) {
            __assert_fail("payload_node->OnlyNodeWithWindows != __null",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x33e3,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          if ((pIVar8->TabBar != (ImGuiTabBar *)0x0) && ((pIVar8->TabBar->Tabs).Size < 1)) {
            __assert_fail("visible_node->TabBar->Tabs.Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x33e6,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          DockNodeMoveWindows(node,pIVar8);
          DockNodeMoveWindows(pIVar8,node);
          DockSettingsRenameNodeReferences(node->ID,pIVar8->ID);
        }
        if ((node->MergedFlags & 0x800) != 0) {
          pIVar8 = (ImGuiDockNode *)
                   ImGuiStorage::GetVoidPtr(&(ctx->DockContext).Nodes,src_node->LastFocusedNodeId);
          if (pIVar8 == (ImGuiDockNode *)0x0) {
            __assert_fail("last_focused_node != __null",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x33f0,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          pIVar11 = DockNodeGetRootNode(pIVar8);
          pIVar12 = DockNodeGetRootNode(pIVar11);
          if (pIVar11 != pIVar12) {
            __assert_fail("last_focused_root_node == DockNodeGetRootNode(payload_node)",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x33f2,
                          "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
          }
          uVar16 = pIVar8->LocalFlags | 0x800;
          pIVar8->LocalFlags = uVar16;
          pIVar8->MergedFlags = pIVar8->SharedFlags | pIVar8->LocalFlagsInWindows | uVar16;
          uVar16 = node->LocalFlags & 0xfffff7ff;
          node->LocalFlags = uVar16;
          node->MergedFlags = node->SharedFlags | node->LocalFlagsInWindows | uVar16;
          pIVar11->CentralNode = pIVar8;
        }
        if (this->Size != 0) {
          __assert_fail("node->Windows.Size == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                        ,0x33f8,
                        "void ImGui::DockContextProcessDock(ImGuiContext *, ImGuiDockRequest *)");
        }
        DockNodeMoveChildNodes(node,src_node);
      }
      DockContextRemoveNode(ctx,src_node,true);
    }
  }
  if (node->TabBar != (ImGuiTabBar *)0x0) {
    node->TabBar->NextSelectedTabId = IVar14;
  }
  if (GImGui->SettingsDirtyTimer <= 0.0) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  return;
}

Assistant:

void ImGui::DockContextProcessDock(ImGuiContext* ctx, ImGuiDockRequest* req)
{
    IM_ASSERT((req->Type == ImGuiDockRequestType_Dock && req->DockPayload != NULL) || (req->Type == ImGuiDockRequestType_Split && req->DockPayload == NULL));
    IM_ASSERT(req->DockTargetWindow != NULL || req->DockTargetNode != NULL);

    ImGuiContext& g = *ctx;
    IM_UNUSED(g);

    ImGuiWindow* payload_window = req->DockPayload;     // Optional
    ImGuiWindow* target_window = req->DockTargetWindow;
    ImGuiDockNode* node = req->DockTargetNode;
    if (payload_window)
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X target '%s' dock window '%s', split_dir %d\n", node ? node->ID : 0, target_window ? target_window->Name : "NULL", payload_window ? payload_window->Name : "NULL", req->DockSplitDir);
    else
        IMGUI_DEBUG_LOG_DOCKING("DockContextProcessDock node 0x%08X, split_dir %d\n", node ? node->ID : 0, req->DockSplitDir);

    // Decide which Tab will be selected at the end of the operation
    ImGuiID next_selected_id = 0;
    ImGuiDockNode* payload_node = NULL;
    if (payload_window)
    {
        payload_node = payload_window->DockNodeAsHost;
        payload_window->DockNodeAsHost = NULL; // Important to clear this as the node will have its life as a child which might be merged/deleted later.
        if (payload_node && payload_node->IsLeafNode())
            next_selected_id = payload_node->TabBar->NextSelectedTabId ? payload_node->TabBar->NextSelectedTabId : payload_node->TabBar->SelectedTabId;
        if (payload_node == NULL)
            next_selected_id = payload_window->ID;
    }

    // FIXME-DOCK: When we are trying to dock an existing single-window node into a loose window, transfer Node ID as well
    // When processing an interactive split, usually LastFrameAlive will be < g.FrameCount. But DockBuilder operations can make it ==.
    if (node)
        IM_ASSERT(node->LastFrameAlive <= g.FrameCount);
    if (node && target_window && node == target_window->DockNodeAsHost)
        IM_ASSERT(node->Windows.Size > 0 || node->IsSplitNode() || node->IsCentralNode());

    // Create new node and add existing window to it
    if (node == NULL)
    {
        node = DockContextAddNode(ctx, 0);
        node->Pos = target_window->Pos;
        node->Size = target_window->Size;
        if (target_window->DockNodeAsHost == NULL)
        {
            DockNodeAddWindow(node, target_window, true);
            node->TabBar->Tabs[0].Flags &= ~ImGuiTabItemFlags_Unsorted;
            target_window->DockIsActive = true;
        }
    }

    ImGuiDir split_dir = req->DockSplitDir;
    if (split_dir != ImGuiDir_None)
    {
        // Split into two, one side will be our payload node unless we are dropping a loose window
        const ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        const int split_inheritor_child_idx = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Up) ? 1 : 0; // Current contents will be moved to the opposite side
        const float split_ratio = req->DockSplitRatio;
        DockNodeTreeSplit(ctx, node, split_axis, split_inheritor_child_idx, split_ratio, payload_node);  // payload_node may be NULL here!
        ImGuiDockNode* new_node = node->ChildNodes[split_inheritor_child_idx ^ 1];
        new_node->HostWindow = node->HostWindow;
        node = new_node;
    }
    node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_HiddenTabBar);

    if (node != payload_node)
    {
        // Create tab bar before we call DockNodeMoveWindows (which would attempt to move the old tab-bar, which would lead us to payload tabs wrongly appearing before target tabs!)
        if (node->Windows.Size > 0 && node->TabBar == NULL)
        {
            DockNodeAddTabBar(node);
            for (int n = 0; n < node->Windows.Size; n++)
                TabBarAddTab(node->TabBar, ImGuiTabItemFlags_None, node->Windows[n]);
        }

        if (payload_node != NULL)
        {
            // Transfer full payload node (with 1+ child windows or child nodes)
            if (payload_node->IsSplitNode())
            {
                if (node->Windows.Size > 0)
                {
                    // We can dock a split payload into a node that already has windows _only_ if our payload is a node tree with a single visible node.
                    // In this situation, we move the windows of the target node into the currently visible node of the payload.
                    // This allows us to preserve some of the underlying dock tree settings nicely.
                    IM_ASSERT(payload_node->OnlyNodeWithWindows != NULL); // The docking should have been blocked by DockNodePreviewDockSetup() early on and never submitted.
                    ImGuiDockNode* visible_node = payload_node->OnlyNodeWithWindows;
                    if (visible_node->TabBar)
                        IM_ASSERT(visible_node->TabBar->Tabs.Size > 0);
                    DockNodeMoveWindows(node, visible_node);
                    DockNodeMoveWindows(visible_node, node);
                    DockSettingsRenameNodeReferences(node->ID, visible_node->ID);
                }
                if (node->IsCentralNode())
                {
                    // Central node property needs to be moved to a leaf node, pick the last focused one.
                    // FIXME-DOCK: If we had to transfer other flags here, what would the policy be?
                    ImGuiDockNode* last_focused_node = DockContextFindNodeByID(ctx, payload_node->LastFocusedNodeId);
                    IM_ASSERT(last_focused_node != NULL);
                    ImGuiDockNode* last_focused_root_node = DockNodeGetRootNode(last_focused_node);
                    IM_ASSERT(last_focused_root_node == DockNodeGetRootNode(payload_node));
                    last_focused_node->SetLocalFlags(last_focused_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode);
                    node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_CentralNode);
                    last_focused_root_node->CentralNode = last_focused_node;
                }

                IM_ASSERT(node->Windows.Size == 0);
                DockNodeMoveChildNodes(node, payload_node);
            }
            else
            {
                const ImGuiID payload_dock_id = payload_node->ID;
                DockNodeMoveWindows(node, payload_node);
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
            }
            DockContextRemoveNode(ctx, payload_node, true);
        }
        else if (payload_window)
        {
            // Transfer single window
            const ImGuiID payload_dock_id = payload_window->DockId;
            node->VisibleWindow = payload_window;
            DockNodeAddWindow(node, payload_window, true);
            if (payload_dock_id != 0)
                DockSettingsRenameNodeReferences(payload_dock_id, node->ID);
        }
    }
    else
    {
        // When docking a floating single window node we want to reevaluate auto-hiding of the tab bar
        node->WantHiddenTabBarUpdate = true;
    }

    // Update selection immediately
    if (ImGuiTabBar* tab_bar = node->TabBar)
        tab_bar->NextSelectedTabId = next_selected_id;
    MarkIniSettingsDirty();
}